

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O0

optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> * __thiscall
ear::StereoPannerDownmix::handle
          (optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *__return_storage_ptr__,
          StereoPannerDownmix *this,Vector3d *position)

{
  bool bVar1;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar2;
  element_type *peVar3;
  reference_type other;
  double local_1e0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_1d8;
  Type local_1b0;
  Scalar local_178;
  double back;
  Scalar local_138;
  double front;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_128;
  undefined1 local_118 [8];
  VectorXd pvDownmix;
  VectorXd _pv;
  undefined1 local_e0 [8];
  optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> pv;
  Scalar local_c0;
  double local_b8;
  Scalar local_b0;
  Scalar local_a8;
  Scalar local_a0;
  double local_98;
  double local_90;
  Scalar local_88 [3];
  Scalar local_70;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_68;
  int local_48 [2];
  undefined1 local_40 [8];
  MatrixXd downmix;
  Vector3d *position_local;
  StereoPannerDownmix *this_local;
  
  local_48[1] = 2;
  local_48[0] = 5;
  downmix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Index)position;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_40,local_48 + 1,local_48);
  local_70 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
            (&local_68,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_40,&local_70);
  local_88[0] = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (&local_68,local_88);
  local_90 = sqrt(3.0);
  local_90 = local_90 / 3.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_90);
  local_98 = sqrt(0.5);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_98);
  local_a0 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_a0);
  local_a8 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_a8);
  local_b0 = 1.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_b0);
  local_b8 = sqrt(3.0);
  local_b8 = local_b8 / 3.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_b8);
  local_c0 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_c0);
  pv.super_type.m_storage.dummy_._8_8_ = sqrt(0.5);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
            (pCVar2,(Scalar *)((long)&pv.super_type.m_storage.dummy_ + 8));
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_68);
  peVar3 = std::
           __shared_ptr_access<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->_psp);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             &_pv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
             position);
  (**peVar3->_vptr_PointSourcePanner)
            (local_e0,peVar3,
             &_pv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  bVar1 = boost::optional<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator!
                    ((optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_e0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    boost::optional<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::optional(__return_storage_ptr__);
  }
  else {
    other = boost::optional<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::get
                      ((optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_e0);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               &pvDownmix.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows,other);
    local_128 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                          ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_40,
                           (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                           &pvDownmix.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                            .m_storage.m_rows);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((Matrix<double,_1,1,0,_1,1> *)local_118,
               (EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&local_128);
    front = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                      ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_118);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_118,&front);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head<int>
              ((Type *)&back,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               &pvDownmix.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows,3);
    local_138 = Eigen::
                DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>::
                maxCoeff((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                          *)&back);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::tail<int>
              (&local_1b0,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               &pvDownmix.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows,2);
    local_178 = Eigen::
                DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>::
                maxCoeff((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                          *)&local_1b0);
    local_1e0 = pow(0.5,(local_178 * 0.5) / (local_138 + local_178));
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
              (&local_1d8,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_118,&local_1e0);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,_1,1,0,_1,1> *)local_118,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                *)&local_1d8);
    boost::optional<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::optional
              (__return_storage_ptr__,(rval_reference_type)local_118);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_118);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               &pvDownmix.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows);
  }
  boost::optional<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~optional
            ((optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_e0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

boost::optional<Eigen::VectorXd> StereoPannerDownmix::handle(
      Eigen::Vector3d position) const {
    Eigen::MatrixXd downmix(2, 5);
    downmix << 1.0, 0.0, std::sqrt(3.0) / 3.0, std::sqrt(0.5), 0.0,  //
        0.0, 1.0, std::sqrt(3.0) / 3.0, 0.0, std::sqrt(0.5);

    // pan with 0+5+0, downmix and power normalise
    boost::optional<Eigen::VectorXd> pv = _psp->handle(position);

    if (pv) {
      Eigen::VectorXd _pv = pv.get();
      Eigen::VectorXd pvDownmix = downmix * _pv;
      pvDownmix /= pvDownmix.norm();

      // vary the output level by the balance between the front and rear
      // loudspeakers; 0dB at the front to -3dB at the back
      double front = _pv.head(3).maxCoeff();
      double back = _pv.tail(2).maxCoeff();

      pvDownmix = pvDownmix * std::pow(0.5, (0.5 * back / (front + back)));
      return pvDownmix;
    }
    return boost::none;
  }